

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O1

int __thiscall
adios2::Remote::LaunchRemoteServerViaConnectionManager(Remote *this,string *remoteHost)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  iterator iVar4;
  long *plVar5;
  char *pcVar6;
  undefined8 *puVar7;
  HostConfig *ho;
  _Base_ptr p_Var8;
  size_type *psVar9;
  _Base_ptr p_Var10;
  char *value;
  NetworkSocket socket;
  string cookie;
  string request;
  char *rest;
  char response [2048];
  allocator local_971;
  char *local_970;
  NetworkSocket local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string *local_8a0;
  undefined1 *local_898 [2];
  undefined1 local_888 [16];
  string local_878;
  string local_858;
  string local_838 [64];
  
  if (remoteHost->_M_string_length == 0) {
    return 0x6658;
  }
  iVar2 = std::__cxx11::string::compare((char *)remoteHost);
  if (iVar2 == 0) {
    return 0x6658;
  }
  helper::NetworkSocket::NetworkSocket(&local_968);
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"localhost","");
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"tcp","");
  helper::NetworkSocket::Connect(&local_968,&local_858,30000,&local_878);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
          ::find(&((this->m_HostOptions).
                   super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_M_t,remoteHost);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(((this->m_HostOptions).
         super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var8 = *(_Base_ptr *)(iVar4._M_node + 2);
    if (p_Var8 != iVar4._M_node[2]._M_parent) {
      p_Var10 = (_Base_ptr)0x0;
      do {
        if (p_Var8[1]._M_color == _S_black) {
          p_Var10 = p_Var8;
        }
        p_Var8 = (_Base_ptr)&p_Var8[6]._M_right;
      } while (p_Var8 != iVar4._M_node[2]._M_parent);
      goto LAB_0063e98e;
    }
  }
  p_Var10 = (_Base_ptr)0x0;
LAB_0063e98e:
  paVar1 = &local_838[0].field_2;
  if (p_Var10 == (_Base_ptr)0x0) {
    local_838[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"Toolkit","");
    local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"Remote","");
    local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"EstablishConnection","");
    std::operator+(&local_960,"No ssh configuration found for host ",remoteHost);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_960);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_940.field_2._M_allocated_capacity = *psVar9;
      local_940.field_2._8_8_ = plVar5[3];
      local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
    }
    else {
      local_940.field_2._M_allocated_capacity = *psVar9;
      local_940._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_940._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    helper::Throw<std::invalid_argument>(local_838,&local_8c0,&local_900,&local_940,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_940._M_dataplus._M_p != &local_940.field_2) {
      operator_delete(local_940._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_960._M_dataplus._M_p != &local_960.field_2) {
      operator_delete(local_960._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900._M_dataplus._M_p != &local_900.field_2) {
      operator_delete(local_900._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
      operator_delete(local_8c0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_838[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_838[0]._M_dataplus._M_p);
    }
  }
  std::operator+(&local_900,"/run_service?group=",remoteHost);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_900);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_838[0].field_2._0_8_ = *psVar9;
    local_838[0].field_2._8_8_ = plVar5[3];
    local_838[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_838[0].field_2._0_8_ = *psVar9;
    local_838[0]._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_838[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)local_838,*(ulong *)p_Var10);
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_8c0.field_2._M_allocated_capacity = *psVar9;
    local_8c0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_8c0.field_2._M_allocated_capacity = *psVar9;
    local_8c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_8c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_838[0]._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p);
  }
  helper::NetworkSocket::RequestResponse(&local_968,&local_8c0,(char *)local_838,0x800);
  local_900._M_string_length = 0;
  local_900.field_2._M_local_buf[0] = '\0';
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  local_8a0 = local_838;
  pcVar6 = strtok_r((char *)local_838,",",(char **)&local_8a0);
  iVar2 = -1;
  if (pcVar6 != (char *)0x0) {
    do {
      local_970 = pcVar6;
      pcVar6 = strtok_r(pcVar6,":",&local_970);
      iVar3 = strncmp(pcVar6,"port",4);
      if (iVar3 == 0) {
        iVar2 = atoi(local_970);
      }
      else {
        iVar3 = strncmp(pcVar6,"cookie",6);
        if (iVar3 == 0) {
          std::__cxx11::string::string((string *)&local_940,local_970,(allocator *)&local_960);
          std::__cxx11::string::operator=((string *)&local_900,(string *)&local_940);
        }
        else {
          iVar3 = strncmp(pcVar6,"msg",3);
          if (iVar3 == 0) {
            iVar3 = strcmp(local_970,"no_error");
            if (iVar3 == 0) goto LAB_0063ef99;
            local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"Toolkit","");
            local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"Remote","");
            local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8e0,"EstablishConnection","");
            std::__cxx11::string::string((string *)local_898,local_970,&local_971);
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)local_898,0,(char *)0x0,0x75ca70);
            local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
            psVar9 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_920.field_2._M_allocated_capacity = *psVar9;
              local_920.field_2._8_8_ = puVar7[3];
            }
            else {
              local_920.field_2._M_allocated_capacity = *psVar9;
              local_920._M_dataplus._M_p = (pointer)*puVar7;
            }
            local_920._M_string_length = puVar7[1];
            *puVar7 = psVar9;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            helper::Throw<std::invalid_argument>(&local_940,&local_960,&local_8e0,&local_920,-1);
          }
          else {
            local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"Toolkit","");
            local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"Remote","");
            local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_8e0,"EstablishConnection","");
            std::__cxx11::string::string((string *)local_898,pcVar6,&local_971);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_898,0,(char *)0x0,0x75ca99);
            local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
            psVar9 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_920.field_2._M_allocated_capacity = *psVar9;
              local_920.field_2._8_8_ = plVar5[3];
            }
            else {
              local_920.field_2._M_allocated_capacity = *psVar9;
              local_920._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_920._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            helper::Throw<std::invalid_argument>(&local_940,&local_960,&local_8e0,&local_920,-1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_920._M_dataplus._M_p != &local_920.field_2) {
            operator_delete(local_920._M_dataplus._M_p);
          }
          if (local_898[0] != local_888) {
            operator_delete(local_898[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
            operator_delete(local_8e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_960._M_dataplus._M_p != &local_960.field_2) {
            operator_delete(local_960._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_940._M_dataplus._M_p != &local_940.field_2) {
          operator_delete(local_940._M_dataplus._M_p);
        }
      }
LAB_0063ef99:
      pcVar6 = strtok_r((char *)local_8a0,",",(char **)&local_8a0);
    } while (pcVar6 != (char *)0x0);
  }
  helper::NetworkSocket::Close(&local_968);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p);
  }
  helper::NetworkSocket::~NetworkSocket(&local_968);
  return iVar2;
}

Assistant:

int Remote::LaunchRemoteServerViaConnectionManager(const std::string remoteHost)
{
    if (remoteHost.empty() || remoteHost == "localhost")
    {
        // std::cout << "Remote::LaunchRemoteServerViaConnectionManager: Assume server is already "
        //              "running at on localhost at port = "
        //           << 26200 << std::endl;
        return 26200;
    }

    helper::NetworkSocket socket;
    socket.Connect("localhost", 30000);

    struct adios2::HostConfig *hostconf = nullptr;

    auto it = m_HostOptions->find(remoteHost);
    if (it != m_HostOptions->end())
    {
        for (auto &ho : it->second)
        {
            if (ho.protocol == HostAccessProtocol::SSH)
            {
                hostconf = &ho;
            }
        }
    }
    if (!hostconf)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                             "No ssh configuration found for host " + remoteHost +
                                                 ". Add config in ~/.config/adios2/hosts.yaml");
    }

    std::string request = "/run_service?group=" + remoteHost + "&service=" + hostconf->name;

    char response[2048];
    socket.RequestResponse(request, response, 2048);

    // responses:
    //   port:-1,msg:incomplete_service_definition
    //   port:-1,msg:missing_service_in_request
    //   port:26200,cookie:0xd93d91e3643c9869,msg:no_error

    char *token;
    char *rest = response;

    int serverPort = -1;
    std::string cookie;

    // std::cout << "Response = \"" << response << "\"" << std::endl;
    while ((token = strtok_r(rest, ",", &rest)))
    {
        char *key;
        char *value = token;
        key = strtok_r(value, ":", &value);
        if (!strncmp(key, "port", 4))
        {
            serverPort = atoi(value);
        }
        else if (!strncmp(key, "cookie", 6))
        {
            cookie = std::string(value);
        }
        else if (!strncmp(key, "msg", 3))
        {
            if (strcmp(value, "no_error"))
            {
                helper::Throw<std::invalid_argument>("Toolkit", "Remote", "EstablishConnection",
                                                     "Error response from connection manager: " +
                                                         std::string(value));
            }
        }
        else
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "Remote", "EstablishConnection",
                "Invalid response from connection manager. Do not understand key " +
                    std::string(key));
        }
    }

    socket.Close();
    return serverPort;
}